

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[38]>(string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                           char (*args) [38])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_98;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  iterator local_38;
  undefined8 local_30;
  char (*local_28) [38];
  char (*args_local) [38];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_28 = args;
  args_local = (char (*) [38])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_68 = cmAlphaNum::View(a);
  local_58 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_98,*local_28);
  local_48 = cmAlphaNum::View(&local_98);
  local_38 = &local_68;
  local_30 = 3;
  views._M_len = 3;
  views._M_array = local_38;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}